

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gc.cpp
# Opt level: O0

process_identifier anon_unknown.dwarf_44f6e::Gc::make_process_id(int index)

{
  int id;
  int index_local;
  
  return index + 0x1eef;
}

Assistant:

process_identifier Gc::make_process_id (int index) {
        int const id = 7919 + index; // No significance to this number: it's just the 1000th prime
#ifdef _WIN32
        HANDLE event = ::CreateEventW (nullptr, // event attributes
                                       false,   // manual reset
                                       false,   // initial state
                                       nullptr  // name
        );
        if (event == nullptr) {
            raise (pstore::win32_erc{::GetLastError ()}, "CreateEventW");
        }
        return std::make_shared<pstore::broker::win32::process_pair> (event, id);
#else
        return id;
#endif // _WIN32
    }